

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out)

{
  char cVar1;
  size_t __n;
  size_type index;
  undefined1 *__s2;
  int iVar2;
  const_reference pvVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  string_type name;
  undefined1 local_a8 [16];
  _func_int **local_98;
  refcount_ptr<boost::exception_detail::error_info_container> local_90;
  char *pcStack_88;
  char *local_80;
  undefined8 local_78;
  error_type local_70;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  source_location local_48;
  
  pcVar5 = cur->_M_current;
  if ((pcVar5 == end._M_current) || (cur->_M_current = pcVar5 + 1, *pcVar5 != '<')) {
    std::runtime_error::runtime_error((runtime_error *)local_a8,"invalid named back-reference");
    local_90.px_ = (error_info_container *)0x0;
    local_a8._0_8_ = &PTR__regex_error_00195328;
    local_98 = (_func_int **)&PTR__regex_error_00195350;
    local_70 = error_badmark;
    pcStack_88 = 
    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
    ;
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
    ;
    local_78._0_4_ = 0x530;
    local_78._4_4_ = -1;
    throw_exception<boost::xpressive::regex_error>((regex_error *)local_a8);
  }
  pcVar5 = cur->_M_current;
  bVar8 = pcVar5 == end._M_current;
  pcVar6 = pcVar5;
  if (!bVar8) {
    cVar1 = *pcVar5;
    while (cVar1 != '>') {
      pcVar6 = pcVar6 + 1;
      cur->_M_current = pcVar6;
      bVar8 = pcVar6 == end._M_current;
      if (bVar8) break;
      cVar1 = *pcVar6;
    }
  }
  if (((pcVar6 == pcVar5) || (bVar8)) || (*pcVar6 != '>')) {
    std::runtime_error::runtime_error((runtime_error *)local_a8,"invalid named back-reference");
    local_90.px_ = (error_info_container *)0x0;
    local_a8._0_8_ = &PTR__regex_error_00195328;
    local_98 = (_func_int **)&PTR__regex_error_00195350;
    local_70 = error_badmark;
    pcStack_88 = 
    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
    ;
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
    ;
    local_78._0_4_ = 0x535;
    local_78._4_4_ = -1;
    throw_exception<boost::xpressive::regex_error>((regex_error *)local_a8);
  }
  cur->_M_current = pcVar6 + 1;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_68,pcVar5,pcVar6);
  __s2 = local_68;
  puVar4 = *(undefined8 **)(this + 0xb8);
  if (*(long *)(this + 0xc0) - (long)puVar4 != 0) {
    lVar7 = (*(long *)(this + 0xc0) - (long)puVar4 >> 3) * -0x3333333333333333;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    do {
      __n = puVar4[1];
      if ((__n == local_60) && ((__n == 0 || (iVar2 = bcmp((void *)*puVar4,__s2,__n), iVar2 == 0))))
      {
        index = puVar4[4];
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),index);
        pcVar5 = (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),index);
        local_98 = (_func_int **)out._16_8_;
        local_a8._0_8_ = out.out_.container;
        local_a8._8_8_ = out.traits_;
        lVar7 = (long)(pvVar3->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second._M_current - (long)pcVar5;
        if (0 < lVar7) {
          lVar7 = lVar7 + 1;
          do {
            detail::
            case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                         *)local_a8,*pcVar5);
            pcVar5 = pcVar5 + 1;
            local_98 = (_func_int **)((ulong)local_98 & 0xffffffff00000000);
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
        *(_func_int ***)&__return_storage_ptr__->next_ = local_98;
        (__return_storage_ptr__->out_).container =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_;
        __return_storage_ptr__->traits_ = (traits<char> *)local_a8._8_8_;
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        return __return_storage_ptr__;
      }
      puVar4 = puVar4 + 5;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  std::runtime_error::runtime_error((runtime_error *)local_a8,"invalid named back-reference");
  local_90.px_ = (error_info_container *)0x0;
  pcStack_88 = (char *)0x0;
  local_80 = (char *)0x0;
  local_78._0_4_ = -1;
  local_78._4_4_ = -1;
  local_a8._0_8_ = &PTR__regex_error_00195328;
  local_98 = (_func_int **)&PTR__regex_error_00195350;
  local_70 = error_badmark;
  local_48.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
  ;
  local_48.function_ =
       "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_named_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
  ;
  local_48.line_ = 0x541;
  local_48.column_ = 0;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_a8,&local_48);
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }